

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

unsigned_long __thiscall rlist::listLength(rlist *this)

{
  unsigned_long uVar1;
  listNode *plVar2;
  
  this->length = 0;
  plVar2 = this->rl->head;
  uVar1 = 0;
  if (plVar2 != (listNode *)0x0) {
    do {
      uVar1 = uVar1 + 1;
      plVar2 = plVar2->next;
    } while (plVar2 != (listNode *)0x0);
    this->view = (listNode *)0x0;
    this->length = uVar1;
  }
  this->rl->len = uVar1;
  return uVar1;
}

Assistant:

unsigned long rlist::listLength(){
    length=0;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=nullptr){
            length++;
            view=view->next;
        }
    } 
    return rl->len=length;
}